

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  pointer pTVar1;
  uint64_t *puVar2;
  pointer pTVar3;
  Type TVar4;
  Result RVar5;
  Enum EVar6;
  Index IVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint64_t local_88;
  undefined8 uStack_80;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar5 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar5.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                      ,0x3b,"Index wabt::Var::index() const");
      }
      pTVar3 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pTVar1 = pTVar3 + (var->field_2).index_;
      EVar6 = (pTVar1->element).enum_;
      IVar7 = (pTVar1->element).type_index_;
      uVar8 = (undefined4)(pTVar1->limits).initial;
      uVar9 = *(undefined4 *)((long)&(pTVar1->limits).initial + 4);
      puVar2 = &pTVar3[(var->field_2).index_].limits.max;
      local_88 = *puVar2;
      uStack_80 = puVar2[1];
    }
    else {
      EVar6 = Any;
      IVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      local_88 = 0;
      uStack_80 = 0;
    }
    TVar4.type_index_ = IVar7;
    TVar4.enum_ = EVar6;
    (out->limits).max = local_88;
    (out->limits).has_max = (bool)(undefined1)uStack_80;
    (out->limits).is_shared = (bool)uStack_80._1_1_;
    (out->limits).is_64 = (bool)uStack_80._2_1_;
    *(undefined5 *)&(out->limits).field_0x13 = uStack_80._3_5_;
    out->element = TVar4;
    (out->limits).initial = CONCAT44(uVar9,uVar8);
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}